

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::ColorQuant::reduceNode(ColorQuant *this,Node *node)

{
  Node *this_00;
  long lVar1;
  
  lVar1 = 4;
  do {
    this_00 = node->children[lVar1 + -4];
    if (this_00 != (Node *)0x0) {
      node->r = node->r + this_00->r;
      node->g = node->g + this_00->g;
      node->b = node->b + this_00->b;
      node->a = node->a + this_00->a;
      node->numPixels = node->numPixels + this_00->numPixels;
      Node::destroy(this_00);
      node->children[lVar1 + -4] = (Node *)0x0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x14);
  (node->link).next = &(this->leaves).link;
  (node->link).prev = (this->leaves).link.prev;
  ((this->leaves).link.prev)->next = &node->link;
  (this->leaves).link.prev = &node->link;
  return;
}

Assistant:

void
ColorQuant::reduceNode(Node *node)
{
	int i;
	assert(node->numPixels == 0);
	for(i = 0; i < 16; i++)
		if(node->children[i]){
			node->r += node->children[i]->r;
			node->g += node->children[i]->g;
			node->b += node->children[i]->b;
			node->a += node->children[i]->a;
			node->numPixels += node->children[i]->numPixels;
			node->children[i]->destroy();
			node->children[i] = nil;
		}
	assert(node->link.next == nil);
	assert(node->link.prev == nil);
	this->leaves.append(&node->link);
}